

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O0

string * tinyusdz::io::FindFile
                   (string *__return_storage_ptr__,string *filename,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *search_paths)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  string *dir;
  string local_58;
  byte local_31;
  ulong local_30;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *search_paths_local;
  string *filename_local;
  string *absPath;
  
  local_20 = search_paths;
  search_paths_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)filename;
  filename_local = __return_storage_ptr__;
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(local_20);
    if (bVar1) {
      i._7_1_ = 0;
      ExpandFilePath(__return_storage_ptr__,(string *)search_paths_local,(void *)0x0);
      bVar1 = FileExists(__return_storage_ptr__,(void *)0x0);
      if (bVar1) {
        i._7_1_ = 1;
      }
      i._0_4_ = (uint)bVar1;
      if ((i._7_1_ & 1) == 0) {
        ::std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      if ((uint)i != 0) {
        return __return_storage_ptr__;
      }
    }
    for (local_30 = 0; uVar2 = local_30,
        sVar3 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_20), uVar2 < sVar3; local_30 = local_30 + 1) {
      local_31 = 0;
      dir = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_20,local_30);
      JoinPath(&local_58,dir,(string *)search_paths_local);
      ExpandFilePath(__return_storage_ptr__,&local_58,(void *)0x0);
      ::std::__cxx11::string::~string((string *)&local_58);
      bVar1 = FileExists(__return_storage_ptr__,(void *)0x0);
      if (bVar1) {
        local_31 = 1;
      }
      i._0_4_ = (uint)bVar1;
      if ((local_31 & 1) == 0) {
        ::std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      if ((uint)i != 0) {
        return __return_storage_ptr__;
      }
    }
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)search_paths_local);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FindFile(const std::string &filename,
                     const std::vector<std::string> &search_paths) {
  // TODO: Use ghc filesystem?

  if (filename.empty()) {
    return filename;
  }

  if (search_paths.empty()) {
    std::string absPath = io::ExpandFilePath(filename, /* userdata */ nullptr);
    if (io::FileExists(absPath, /* userdata */ nullptr)) {
      return absPath;
    }
  }

  for (size_t i = 0; i < search_paths.size(); i++) {
    std::string absPath = io::ExpandFilePath(
        io::JoinPath(search_paths[i], filename), /* userdata */ nullptr);
    if (io::FileExists(absPath, /* userdata */ nullptr)) {
      return absPath;
    }
  }

  return std::string();
}